

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::Parser::LocationRecorder::StartAt
          (LocationRecorder *this,LocationRecorder *other)

{
  RepeatedField<int> *pRVar1;
  Location *pLVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  
  pLVar2 = this->location_;
  pRVar1 = &(other->location_->field_0)._impl_.span_;
  iVar3 = protobuf::internal::SooRep::size
                    (&pRVar1->soo_rep_,(*(byte *)((long)&other->location_->field_0 + 0x20) & 4) == 0
                    );
  if (iVar3 < 1) {
    StartAt();
LAB_0037c923:
    StartAt();
  }
  else {
    piVar5 = RepeatedField<int>::elements
                       (pRVar1,(undefined1  [16])
                               ((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4
                               ) == (undefined1  [16])0x0);
    iVar3 = *piVar5;
    pRVar1 = &(pLVar2->field_0)._impl_.span_;
    iVar4 = protobuf::internal::SooRep::size
                      (&pRVar1->soo_rep_,(*(byte *)((long)&pLVar2->field_0 + 0x20) & 4) == 0);
    if (iVar4 < 1) goto LAB_0037c923;
    piVar5 = RepeatedField<int>::elements
                       (pRVar1,(undefined1  [16])
                               ((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4
                               ) == (undefined1  [16])0x0);
    *piVar5 = iVar3;
    pLVar2 = this->location_;
    pRVar1 = &(other->location_->field_0)._impl_.span_;
    iVar3 = protobuf::internal::SooRep::size
                      (&pRVar1->soo_rep_,
                       (*(byte *)((long)&other->location_->field_0 + 0x20) & 4) == 0);
    if (1 < iVar3) {
      piVar5 = RepeatedField<int>::elements
                         (pRVar1,(undefined1  [16])
                                 ((undefined1  [16])(pRVar1->soo_rep_).field_0 &
                                 (undefined1  [16])0x4) == (undefined1  [16])0x0);
      iVar3 = piVar5[1];
      pRVar1 = &(pLVar2->field_0)._impl_.span_;
      iVar4 = protobuf::internal::SooRep::size
                        (&pRVar1->soo_rep_,(*(byte *)((long)&pLVar2->field_0 + 0x20) & 4) == 0);
      if (1 < iVar4) {
        piVar5 = RepeatedField<int>::elements
                           (pRVar1,(undefined1  [16])
                                   ((undefined1  [16])(pRVar1->soo_rep_).field_0 &
                                   (undefined1  [16])0x4) == (undefined1  [16])0x0);
        piVar5[1] = iVar3;
        return;
      }
      goto LAB_0037c937;
    }
  }
  StartAt();
LAB_0037c937:
  StartAt();
}

Assistant:

void Parser::LocationRecorder::StartAt(const LocationRecorder& other) {
  location_->set_span(0, other.location_->span(0));
  location_->set_span(1, other.location_->span(1));
}